

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_compress_destSize(char *src,char *dst,int *srcSizePtr,int targetDstSize)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  short sVar5;
  long lVar6;
  char cVar7;
  int iVar8;
  BYTE *s;
  char *__s;
  ulong uVar9;
  long *plVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong *puVar14;
  uint uVar15;
  long *plVar16;
  ulong *puVar17;
  BYTE *e_1;
  char *pcVar18;
  char cVar19;
  char *pcVar20;
  char *pcVar21;
  long *plVar22;
  long *plVar23;
  int *in_R8;
  ulong *puVar24;
  ulong uVar25;
  ulong uVar26;
  int *piVar27;
  long lVar28;
  long *plVar29;
  long *plVar30;
  ulong uVar31;
  int iVar32;
  char *pcVar33;
  uint uVar34;
  ulong uVar35;
  long lVar36;
  U16 *hashTable;
  long *local_b8;
  
  pcVar20 = (char *)0x4020;
  __s = (char *)malloc(0x4020);
  if (__s == (char *)0x0) {
    return 0;
  }
  if (((ulong)__s & 7) == 0) {
    pcVar20 = __s;
    memset(__s,0,0x4020);
  }
  uVar34 = *srcSizePtr;
  uVar35 = (ulong)uVar34;
  iVar8 = 0;
  if (uVar35 < 0x7e000001) {
    iVar8 = (uint)(uVar35 * 0x8080808081 >> 0x27) + 0x10;
  }
  if (iVar8 <= targetDstSize) {
    iVar8 = LZ4_compress_fast_extState(__s,src,dst,uVar34,targetDstSize,1);
    goto LAB_00375166;
  }
  iVar2 = (int)dst;
  local_b8 = (long *)src;
  if ((int)uVar34 < 0x1000b) {
    iVar8 = 0;
    if (0x7e000000 < uVar34) goto LAB_00375166;
    if (uVar35 == 0) {
      iVar8 = 0;
      if (0 < targetDstSize) {
        *dst = '\0';
        *srcSizePtr = 0;
        iVar8 = 1;
      }
      goto LAB_00375166;
    }
    if (targetDstSize < 1) goto LAB_00375166;
    uVar12 = *(uint *)(__s + 0x4010);
    *(uint *)(__s + 0x4018) = *(int *)(__s + 0x4018) + uVar34;
    pcVar18 = dst + targetDstSize;
    *(uint *)(__s + 0x4010) = uVar34 + uVar12;
    __s[0x4014] = '\x03';
    __s[0x4015] = '\0';
    __s[0x4016] = '\0';
    __s[0x4017] = '\0';
    if (0xc < (int)uVar34) {
      lVar36 = (long)src - (ulong)uVar12;
      *(short *)(__s + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) = (short)uVar12;
      plVar30 = (long *)(src + 1);
      uVar34 = (uint)(*(int *)(src + 1) * -0x61c8864f) >> 0x13;
      plVar29 = (long *)dst;
      do {
        uVar12 = 0x40;
        uVar15 = 1;
        do {
          plVar23 = plVar30;
          plVar30 = (long *)((ulong)uVar15 + (long)plVar23);
          sVar5 = (short)lVar36;
          if (src + (uVar35 - 0xb) < plVar30) {
            iVar8 = 2;
          }
          else {
            uVar1 = *(ushort *)(__s + (ulong)uVar34 * 2);
            lVar6 = *plVar30;
            *(short *)(__s + (ulong)uVar34 * 2) = (short)plVar23 - sVar5;
            iVar8 = 7;
            if (*(int *)(lVar36 + (ulong)uVar1) != (int)*plVar23) {
              iVar8 = 0;
            }
            pcVar20 = (char *)((ulong)uVar1 + lVar36);
            uVar34 = (uint)((int)lVar6 * -0x61c8864f) >> 0x13;
          }
          uVar15 = uVar12 >> 6;
          uVar12 = uVar12 + 1;
        } while (iVar8 == 0);
        if (iVar8 == 7) {
          iVar8 = 0;
        }
        dst = (char *)plVar29;
        plVar30 = plVar23;
        if (iVar8 == 0) {
          iVar8 = (int)plVar23 - (int)local_b8;
          lVar6 = 0;
          cVar7 = (char)plVar23 * '\x10' + (char)local_b8 * -0x10;
          uVar12 = iVar8 - 0xfU;
          do {
            uVar15 = uVar12;
            cVar19 = cVar7;
            lVar28 = lVar6;
            pcVar33 = pcVar20 + lVar28;
            plVar30 = (long *)(lVar28 + (long)plVar23);
            if ((pcVar33 <= src) || (plVar30 <= local_b8)) break;
            lVar6 = lVar28 + -1;
            cVar7 = cVar19 + -0x10;
            uVar12 = uVar15 - 1;
          } while (*(char *)((long)plVar23 + lVar28 + -1) == pcVar20[lVar28 + -1]);
          iVar32 = (int)lVar28;
          uVar31 = (ulong)(uint)(iVar32 + ((int)plVar23 - (int)local_b8));
          pcVar21 = (char *)((long)plVar29 + uVar31 + (ulong)(iVar8 + iVar32 + 0xf0) / 0xff + 0xc);
          if (pcVar18 < pcVar21) {
            iVar8 = 2;
            plVar16 = plVar29;
          }
          else {
            plVar22 = (long *)((long)plVar29 + 1);
            if ((uint)(iVar8 + iVar32) < 0xf) {
              *(char *)plVar29 = cVar19;
            }
            else {
              uVar9 = (ulong)(iVar8 - 0xfU) + lVar28;
              *(char *)plVar29 = -0x10;
              if (0xfe < (int)uVar9) {
                if (0x1fc < (int)uVar15) {
                  uVar15 = 0x1fd;
                }
                uVar12 = (iVar8 - uVar15) + iVar32 + 0xef;
                uVar9 = (ulong)uVar12 / 0xff;
                memset(plVar22,0xff,(ulong)(uVar12 / 0xff + 1));
                plVar22 = (long *)((long)plVar29 + uVar9 + 2);
                uVar9 = (ulong)(uint)(iVar8 + -0x10e + iVar32 + (int)uVar9 * -0xff);
              }
              *(char *)plVar22 = (char)uVar9;
              plVar22 = (long *)((long)plVar22 + 1);
            }
            plVar16 = (long *)(uVar31 + (long)plVar22);
            plVar10 = local_b8;
            do {
              *plVar22 = *plVar10;
              plVar22 = plVar22 + 1;
              plVar10 = plVar10 + 1;
            } while (plVar22 < plVar16);
            iVar8 = 0;
          }
          pcVar20 = pcVar33;
          dst = (char *)plVar16;
          if (pcVar21 <= pcVar18) {
            iVar8 = 2;
            do {
              pcVar20 = pcVar33;
              dst = (char *)plVar29;
              if (pcVar18 < (char *)((long)plVar16 + 0xb)) goto LAB_00374e37;
              *(short *)plVar16 = (short)plVar30 - (short)pcVar33;
              puVar17 = (ulong *)((long)plVar30 + 4);
              puVar24 = (ulong *)(pcVar33 + 4);
              puVar14 = puVar17;
              if (puVar17 < src + (uVar35 - 0xc)) {
                uVar9 = *(ulong *)((long)plVar30 + 4) ^ *(ulong *)(pcVar33 + 4);
                uVar31 = 0;
                if (uVar9 != 0) {
                  for (; (uVar9 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                uVar31 = uVar31 >> 3 & 0x1fffffff;
                puVar14 = (ulong *)((long)plVar30 + 0xc);
                puVar24 = (ulong *)(pcVar33 + 0xc);
                if (*(ulong *)(pcVar33 + 4) == *(ulong *)((long)plVar30 + 4)) goto LAB_00374e98;
              }
              else {
LAB_00374e98:
                do {
                  if (src + (uVar35 - 0xc) <= puVar14) {
                    if ((puVar14 < src + (uVar35 - 8)) && ((int)*puVar24 == (int)*puVar14)) {
                      puVar14 = (ulong *)((long)puVar14 + 4);
                      puVar24 = (ulong *)((long)puVar24 + 4);
                    }
                    if ((puVar14 < src + (uVar35 - 6)) && ((short)*puVar24 == (short)*puVar14)) {
                      puVar14 = (ulong *)((long)puVar14 + 2);
                      puVar24 = (ulong *)((long)puVar24 + 2);
                    }
                    if (puVar14 < src + (uVar35 - 5)) {
                      puVar14 = (ulong *)((long)puVar14 + (ulong)((char)*puVar24 == (char)*puVar14))
                      ;
                    }
                    uVar31 = (ulong)(uint)((int)puVar14 - (int)puVar17);
                    goto LAB_00374ed5;
                  }
                  uVar31 = *puVar24;
                  uVar9 = *puVar14;
                  uVar25 = uVar9 ^ uVar31;
                  uVar11 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                    }
                  }
                  iVar32 = (int)puVar14;
                  puVar24 = puVar24 + 1;
                  puVar14 = puVar14 + 1;
                } while (uVar31 == uVar9);
                uVar31 = (ulong)((((uint)(uVar11 >> 3) & 0x1fffffff) + iVar32) - (int)puVar17);
              }
LAB_00374ed5:
              dst = (char *)((long)plVar16 + 2);
              uVar12 = (uint)uVar31;
              local_b8 = (long *)((long)plVar30 + uVar31 + 4);
              if (pcVar18 < (char *)((long)plVar16 + (ulong)(uVar12 + 0xf0) / 0xff + 8)) {
                uVar15 = ((int)pcVar18 - (int)dst) * 0xff - 0x5ec;
                local_b8 = (long *)((long)local_b8 - (ulong)(uVar12 - uVar15));
                for (plVar30 = local_b8; uVar12 = uVar15, plVar30 <= plVar23;
                    plVar30 = (long *)((long)plVar30 + 1)) {
                  lVar6 = *plVar30;
                  (__s + (ulong)((uint)((int)lVar6 * -0x61c8864f) >> 0x13) * 2)[0] = '\0';
                  (__s + (ulong)((uint)((int)lVar6 * -0x61c8864f) >> 0x13) * 2)[1] = '\0';
                }
              }
              if (uVar12 < 0xf) {
                *(char *)plVar29 = (char)*plVar29 + (char)uVar12;
              }
              else {
                *(char *)plVar29 = (char)*plVar29 + '\x0f';
                uVar15 = uVar12 - 0xf;
                *(undefined4 *)dst = 0xffffffff;
                if (0x3fb < uVar15) {
                  uVar12 = uVar12 - 0x40b;
                  memset((char *)((long)plVar16 + 6),0xff,(ulong)((uVar12 / 0x3fc) * 4 + 4));
                  uVar15 = uVar12 % 0x3fc;
                  dst = (char *)((long)plVar16 + (ulong)((uVar12 / 0x3fc) * 4) + 6);
                }
                pcVar33 = (char *)((long)dst + (ulong)uVar15 / 0xff);
                dst = pcVar33 + 1;
                *pcVar33 = (char)((ulong)uVar15 * 0x8080808081 >> 0x27);
              }
              plVar30 = local_b8;
              if (src + (uVar35 - 0xb) <= local_b8) {
                iVar8 = 3;
                goto LAB_00374e37;
              }
              *(short *)(__s + (ulong)((uint)(*(int *)((long)local_b8 + -2) * -0x61c8864f) >> 0x13)
                               * 2) = ((short)local_b8 + -2) - sVar5;
              uVar31 = (ulong)((uint)((int)*local_b8 * -0x61c8864f) >> 0x13);
              uVar1 = *(ushort *)(__s + uVar31 * 2);
              *(short *)(__s + uVar31 * 2) = (short)local_b8 - sVar5;
              iVar32 = *(int *)(lVar36 + (ulong)uVar1);
              lVar6 = *local_b8;
              plVar16 = (long *)dst;
              if (iVar32 == (int)lVar6) {
                *dst = '\0';
                plVar16 = (long *)((long)dst + 1);
                plVar29 = (long *)dst;
              }
              pcVar33 = (char *)((ulong)uVar1 + lVar36);
            } while (iVar32 == (int)lVar6);
            uVar34 = (uint)(*(int *)((long)local_b8 + 1) * -0x61c8864f) >> 0x13;
            iVar8 = 0;
            pcVar20 = pcVar33;
            dst = (char *)plVar16;
            plVar30 = (long *)((long)local_b8 + 1);
          }
        }
LAB_00374e37:
        plVar29 = (long *)dst;
      } while (iVar8 == 0);
      if (1 < iVar8 - 2U) goto LAB_003759a9;
    }
    pcVar33 = src + (uVar35 - (long)local_b8);
    if (pcVar18 < (char *)((long)dst + (long)(pcVar33 + (ulong)(pcVar33 + 0xf0) / 0xff + 1))) {
      pcVar33 = pcVar18 + (~(ulong)dst - ((ulong)(pcVar18 + ~(ulong)dst + 0xf1) >> 8));
    }
    if (pcVar33 < (char *)0xf) {
      *dst = (char)pcVar33 << 4;
    }
    else {
      pcVar20 = pcVar33 + -0xf;
      *dst = -0x10;
      plVar30 = (long *)((long)dst + 1);
      if ((char *)0xfe < pcVar20) {
        uVar35 = (ulong)(pcVar33 + -0x10e) / 0xff;
        memset(plVar30,0xff,uVar35 + 1);
        plVar30 = (long *)((long)dst + uVar35 + 2);
        pcVar20 = pcVar33 + uVar35 * -0xff + -0x10e;
      }
      *(char *)plVar30 = (char)pcVar20;
      dst = (char *)plVar30;
    }
  }
  else {
    iVar8 = 0;
    if ((0x7e000000 < uVar34) || (targetDstSize < 1)) goto LAB_00375166;
    uVar12 = *(uint *)(__s + 0x4010);
    lVar36 = (long)src - (ulong)uVar12;
    *(uint *)(__s + 0x4018) = *(int *)(__s + 0x4018) + uVar34;
    pcVar20 = dst + targetDstSize;
    *(uint *)(__s + 0x4010) = uVar34 + uVar12;
    __s[0x4014] = '\x02';
    __s[0x4015] = '\0';
    __s[0x4016] = '\0';
    __s[0x4017] = '\0';
    *(uint *)(__s + ((ulong)(*(long *)src * -0x30e4432345000000) >> 0x34) * 4) = uVar12;
    plVar30 = (long *)(src + 1);
    uVar31 = (ulong)(*(long *)(src + 1) * -0x30e4432345000000) >> 0x34;
    do {
      uVar34 = 0x40;
      uVar9 = 1;
      plVar29 = plVar30;
      while( true ) {
        plVar30 = (long *)(uVar9 + (long)plVar29);
        iVar32 = (int)plVar29;
        iVar8 = (int)lVar36;
        if (src + (uVar35 - 0xb) < plVar30) {
          iVar13 = 2;
        }
        else {
          uVar12 = *(uint *)(__s + uVar31 * 4);
          in_R8 = (int *)((ulong)uVar12 + lVar36);
          uVar9 = (ulong)(*plVar30 * -0x30e4432345000000) >> 0x34;
          *(int *)(__s + uVar31 * 4) = iVar32 - iVar8;
          iVar13 = 8;
          uVar31 = uVar9;
          if (((uint)(iVar32 - iVar8) <= uVar12 + 0xffff) && (iVar13 = 7, *in_R8 != (int)*plVar29))
          {
            iVar13 = 0;
          }
        }
        if ((iVar13 != 0) && (iVar13 != 8)) break;
        uVar9 = (ulong)(uVar34 >> 6);
        uVar34 = uVar34 + 1;
        plVar29 = plVar30;
      }
      if (iVar13 == 7) {
        iVar13 = 0;
      }
      plVar23 = (long *)dst;
      plVar30 = plVar29;
      if (iVar13 == 0) {
        iVar13 = iVar32 - (int)local_b8;
        lVar6 = 0;
        uVar34 = iVar13 - 0xfU;
        cVar7 = (char)plVar29 * '\x10' + (char)local_b8 * -0x10;
        do {
          cVar19 = cVar7;
          uVar12 = uVar34;
          lVar28 = lVar6;
          piVar27 = (int *)((long)in_R8 + lVar28);
          plVar30 = (long *)(lVar28 + (long)plVar29);
          if ((piVar27 <= src) || (plVar30 <= local_b8)) break;
          lVar6 = lVar28 + -1;
          uVar34 = uVar12 - 1;
          cVar7 = cVar19 + -0x10;
        } while (*(char *)((long)plVar29 + lVar28 + -1) == *(char *)((long)in_R8 + lVar28 + -1));
        iVar3 = (int)lVar28;
        uVar9 = (ulong)(uint)(iVar3 + (iVar32 - (int)local_b8));
        pcVar33 = (char *)((long)dst + uVar9 + (ulong)(iVar13 + iVar3 + 0xf0) / 0xff + 0xc);
        if (pcVar20 < pcVar33) {
          iVar13 = 2;
          plVar16 = (long *)dst;
        }
        else {
          plVar23 = (long *)((long)dst + 1);
          if ((uint)(iVar13 + iVar3) < 0xf) {
            *dst = cVar19;
          }
          else {
            uVar11 = (ulong)(iVar13 - 0xfU) + lVar28;
            *dst = -0x10;
            if (0xfe < (int)uVar11) {
              if (0x1fc < (int)uVar12) {
                uVar12 = 0x1fd;
              }
              uVar34 = (iVar13 - uVar12) + iVar3 + 0xef;
              uVar11 = (ulong)uVar34 / 0xff;
              memset(plVar23,0xff,(ulong)(uVar34 / 0xff + 1));
              plVar23 = (long *)((long)dst + uVar11 + 2);
              uVar11 = (ulong)(uint)(iVar13 + -0x10e + iVar3 + (int)uVar11 * -0xff);
            }
            *(char *)plVar23 = (char)uVar11;
            plVar23 = (long *)((long)plVar23 + 1);
          }
          plVar16 = (long *)(uVar9 + (long)plVar23);
          plVar22 = local_b8;
          do {
            *plVar23 = *plVar22;
            plVar23 = plVar23 + 1;
            plVar22 = plVar22 + 1;
          } while (plVar23 < plVar16);
          iVar13 = 0;
        }
        in_R8 = piVar27;
        plVar23 = plVar16;
        if (pcVar33 <= pcVar20) {
          iVar13 = 2;
          do {
            in_R8 = piVar27;
            plVar23 = (long *)dst;
            if (pcVar20 < (char *)((long)plVar16 + 0xb)) goto LAB_003757a6;
            *(short *)plVar16 = (short)plVar30 - (short)piVar27;
            puVar24 = (ulong *)((long)plVar30 + 4);
            puVar17 = (ulong *)(piVar27 + 1);
            puVar14 = puVar24;
            if (puVar24 < src + (uVar35 - 0xc)) {
              uVar11 = *(ulong *)((long)plVar30 + 4) ^ *(ulong *)(piVar27 + 1);
              uVar9 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                }
              }
              uVar9 = uVar9 >> 3 & 0x1fffffff;
              puVar14 = (ulong *)((long)plVar30 + 0xc);
              puVar17 = (ulong *)(piVar27 + 3);
              if (*(ulong *)(piVar27 + 1) == *(ulong *)((long)plVar30 + 4)) goto LAB_003754dc;
            }
            else {
LAB_003754dc:
              do {
                if (src + (uVar35 - 0xc) <= puVar14) {
                  if ((puVar14 < src + (uVar35 - 8)) && ((int)*puVar17 == (int)*puVar14)) {
                    puVar14 = (ulong *)((long)puVar14 + 4);
                    puVar17 = (ulong *)((long)puVar17 + 4);
                  }
                  if ((puVar14 < src + (uVar35 - 6)) && ((short)*puVar17 == (short)*puVar14)) {
                    puVar14 = (ulong *)((long)puVar14 + 2);
                    puVar17 = (ulong *)((long)puVar17 + 2);
                  }
                  if (puVar14 < src + (uVar35 - 5)) {
                    puVar14 = (ulong *)((long)puVar14 + (ulong)((char)*puVar17 == (char)*puVar14));
                  }
                  uVar9 = (ulong)(uint)((int)puVar14 - (int)puVar24);
                  goto LAB_00375519;
                }
                uVar9 = *puVar17;
                uVar11 = *puVar14;
                uVar26 = uVar11 ^ uVar9;
                uVar25 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                  }
                }
                iVar32 = (int)puVar14;
                puVar17 = puVar17 + 1;
                puVar14 = puVar14 + 1;
              } while (uVar9 == uVar11);
              uVar9 = (ulong)((((uint)(uVar25 >> 3) & 0x1fffffff) + iVar32) - (int)puVar24);
            }
LAB_00375519:
            plVar23 = (long *)((long)plVar16 + 2);
            uVar34 = (uint)uVar9;
            local_b8 = (long *)((long)plVar30 + uVar9 + 4);
            if (pcVar20 < (char *)((long)plVar16 + (ulong)(uVar34 + 0xf0) / 0xff + 8)) {
              uVar12 = ((int)pcVar20 - (int)plVar23) * 0xff - 0x5ec;
              local_b8 = (long *)((long)local_b8 - (ulong)(uVar34 - uVar12));
              for (plVar30 = local_b8; uVar34 = uVar12, plVar30 <= plVar29;
                  plVar30 = (long *)((long)plVar30 + 1)) {
                pcVar33 = __s + ((ulong)(*plVar30 * -0x30e4432345000000) >> 0x34) * 4;
                pcVar33[0] = '\0';
                pcVar33[1] = '\0';
                pcVar33[2] = '\0';
                pcVar33[3] = '\0';
              }
            }
            if (uVar34 < 0xf) {
              *dst = (char)*(long *)dst + (char)uVar34;
            }
            else {
              *dst = (char)*(long *)dst + '\x0f';
              uVar12 = uVar34 - 0xf;
              *(undefined4 *)plVar23 = 0xffffffff;
              if (0x3fb < uVar12) {
                uVar34 = uVar34 - 0x40b;
                memset((char *)((long)plVar16 + 6),0xff,(ulong)((uVar34 / 0x3fc) * 4 + 4));
                uVar12 = uVar34 % 0x3fc;
                plVar23 = (long *)((long)plVar16 + (ulong)((uVar34 / 0x3fc) * 4) + 6);
              }
              pcVar33 = (char *)((long)plVar23 + (ulong)uVar12 / 0xff);
              plVar23 = (long *)(pcVar33 + 1);
              *pcVar33 = (char)((ulong)uVar12 * 0x8080808081 >> 0x27);
            }
            plVar30 = local_b8;
            if (src + (uVar35 - 0xb) <= local_b8) {
              iVar13 = 3;
              goto LAB_003757a6;
            }
            *(int *)(__s + ((ulong)(*(long *)((long)local_b8 + -2) * -0x30e4432345000000) >> 0x34) *
                           4) = ((int)local_b8 + -2) - iVar8;
            uVar9 = (ulong)(*local_b8 * -0x30e4432345000000) >> 0x34;
            uVar12 = (int)local_b8 - iVar8;
            uVar34 = *(uint *)(__s + uVar9 * 4);
            piVar27 = (int *)((ulong)uVar34 + lVar36);
            *(uint *)(__s + uVar9 * 4) = uVar12;
            bVar4 = true;
            plVar16 = plVar23;
            if ((uVar12 <= uVar34 + 0xffff) && (*piVar27 == (int)*local_b8)) {
              *(char *)plVar23 = '\0';
              bVar4 = false;
              plVar16 = (long *)((long)plVar23 + 1);
              dst = (char *)plVar23;
            }
          } while (!bVar4);
          uVar31 = (ulong)(*(long *)((long)local_b8 + 1) * -0x30e4432345000000) >> 0x34;
          iVar13 = 0;
          in_R8 = piVar27;
          plVar23 = plVar16;
          plVar30 = (long *)((long)local_b8 + 1);
        }
      }
LAB_003757a6:
      dst = (char *)plVar23;
    } while (iVar13 == 0);
    if (1 < iVar13 - 2U) {
LAB_003759a9:
      iVar8 = 0;
      goto LAB_00375166;
    }
    pcVar33 = src + (uVar35 - (long)local_b8);
    if (pcVar20 < (char *)((long)plVar23 + (long)(pcVar33 + (ulong)(pcVar33 + 0xf0) / 0xff + 1))) {
      pcVar33 = pcVar20 + (~(ulong)plVar23 - ((ulong)(pcVar20 + ~(ulong)plVar23 + 0xf1) >> 8));
    }
    if (pcVar33 < (char *)0xf) {
      *(char *)plVar23 = (char)pcVar33 << 4;
    }
    else {
      pcVar20 = pcVar33 + -0xf;
      *(char *)plVar23 = -0x10;
      dst = (char *)((long)plVar23 + 1);
      if ((char *)0xfe < pcVar20) {
        uVar35 = (ulong)(pcVar33 + -0x10e) / 0xff;
        memset(dst,0xff,uVar35 + 1);
        dst = (char *)((long)plVar23 + uVar35 + 2);
        pcVar20 = pcVar33 + uVar35 * -0xff + -0x10e;
      }
      *dst = (char)pcVar20;
    }
  }
  memcpy((char *)((long)dst + 1),local_b8,(size_t)pcVar33);
  *srcSizePtr = ((int)local_b8 + (int)pcVar33) - (int)src;
  iVar8 = ((int)(char *)((long)dst + 1) + (int)pcVar33) - iVar2;
LAB_00375166:
  free(__s);
  return iVar8;
}

Assistant:

int LZ4_compress_destSize(const char* src, char* dst, int* srcSizePtr, int targetDstSize)
{
#if (LZ4_HEAPMODE)
    LZ4_stream_t* ctx = (LZ4_stream_t*)ALLOC(sizeof(LZ4_stream_t));   /* malloc-calloc always properly aligned */
    if (ctx == NULL) return 0;
#else
    LZ4_stream_t ctxBody;
    LZ4_stream_t* ctx = &ctxBody;
#endif

    int result = LZ4_compress_destSize_extState(ctx, src, dst, srcSizePtr, targetDstSize);

#if (LZ4_HEAPMODE)
    FREEMEM(ctx);
#endif
    return result;
}